

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

InterpolationRange * __thiscall
tcu::anon_unknown_3::TriangleInterpolator::interpolate
          (InterpolationRange *__return_storage_ptr__,TriangleInterpolator *this,int primitiveNdx,
          IVec2 *pixel,IVec2 *viewportSize,bool multisample,int subpixelBits)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  float fVar6;
  float fVar7;
  float local_148;
  float local_140;
  float local_13c;
  Vector<float,_3> local_110;
  Vector<float,_3> local_104;
  undefined8 local_f8;
  float local_f0;
  Vector<float,_3> local_ec;
  Vector<float,_3> local_e0;
  undefined8 local_d4;
  float local_cc;
  undefined1 local_c8 [8];
  InterpolationRange weights [4];
  Vec2 corners [4];
  float testSquarePos;
  float testSquareSize;
  bool multisample_local;
  IVec2 *viewportSize_local;
  IVec2 *pixel_local;
  int primitiveNdx_local;
  TriangleInterpolator *this_local;
  InterpolationRange *result;
  
  if (multisample) {
    local_13c = 1.0;
    local_148 = 0.0;
  }
  else {
    local_140 = (float)(ulong)(1L << ((byte)subpixelBits & 0x3f));
    local_13c = 2.0 / local_140;
    local_148 = 0.5 - local_13c / 2.0;
  }
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::x(viewportSize);
  fVar6 = ((float)iVar1 + local_148 + 0.0) / (float)iVar2;
  iVar1 = Vector<int,_2>::y(pixel);
  iVar2 = Vector<int,_2>::y(viewportSize);
  fVar7 = ((float)iVar1 + local_148 + 0.0) / (float)iVar2;
  Vector<float,_2>::Vector
            ((Vector<float,_2> *)(weights[3].min.m_data + 1),fVar6 + fVar6 + -1.0,
             fVar7 + fVar7 + -1.0);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::x(viewportSize);
  fVar6 = ((float)iVar1 + local_148 + 0.0) / (float)iVar2;
  iVar1 = Vector<int,_2>::y(pixel);
  iVar2 = Vector<int,_2>::y(viewportSize);
  fVar7 = ((float)iVar1 + local_148 + local_13c) / (float)iVar2;
  Vector<float,_2>::Vector(corners,fVar6 + fVar6 + -1.0,fVar7 + fVar7 + -1.0);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::x(viewportSize);
  fVar6 = ((float)iVar1 + local_148 + local_13c) / (float)iVar2;
  iVar1 = Vector<int,_2>::y(pixel);
  iVar2 = Vector<int,_2>::y(viewportSize);
  fVar7 = ((float)iVar1 + local_148 + local_13c) / (float)iVar2;
  Vector<float,_2>::Vector(corners + 1,fVar6 + fVar6 + -1.0,fVar7 + fVar7 + -1.0);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::x(viewportSize);
  fVar6 = ((float)iVar1 + local_148 + local_13c) / (float)iVar2;
  iVar1 = Vector<int,_2>::y(pixel);
  iVar2 = Vector<int,_2>::y(viewportSize);
  fVar7 = ((float)iVar1 + local_148 + 0.0) / (float)iVar2;
  Vector<float,_2>::Vector(corners + 2,fVar6 + fVar6 + -1.0,fVar7 + fVar7 + -1.0);
  pvVar3 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  pvVar5 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  calcTriangleInterpolationWeights
            ((InterpolationRange *)local_c8,pvVar3->positions,pvVar4->positions + 1,
             pvVar5->positions + 2,(Vec2 *)(weights[3].min.m_data + 1));
  pvVar3 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  pvVar5 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  calcTriangleInterpolationWeights
            ((InterpolationRange *)(weights[0].min.m_data + 1),pvVar3->positions,
             pvVar4->positions + 1,pvVar5->positions + 2,corners);
  pvVar3 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  pvVar5 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  calcTriangleInterpolationWeights
            ((InterpolationRange *)(weights[1].min.m_data + 1),pvVar3->positions,
             pvVar4->positions + 1,pvVar5->positions + 2,corners + 1);
  pvVar3 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  pvVar5 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](&this->scene->triangles,(long)primitiveNdx);
  calcTriangleInterpolationWeights
            ((InterpolationRange *)(weights[2].min.m_data + 1),pvVar3->positions,
             pvVar4->positions + 1,pvVar5->positions + 2,corners + 2);
  InterpolationRange::InterpolationRange(__return_storage_ptr__);
  min<float,3>((tcu *)&local_e0,(Vector<float,_3> *)(weights[0].max.m_data + 1),
               (Vector<float,_3> *)(weights[1].max.m_data + 1));
  min<float,3>((tcu *)&local_ec,(Vector<float,_3> *)(weights[2].max.m_data + 1),
               (Vector<float,_3> *)(weights[3].max.m_data + 1));
  min<float,3>((tcu *)&local_d4,&local_e0,&local_ec);
  *(undefined8 *)(__return_storage_ptr__->min).m_data = local_d4;
  (__return_storage_ptr__->min).m_data[2] = local_cc;
  max<float,3>((tcu *)&local_104,(Vector<float,_3> *)local_c8,
               (Vector<float,_3> *)(weights[0].min.m_data + 1));
  max<float,3>((tcu *)&local_110,(Vector<float,_3> *)(weights[1].min.m_data + 1),
               (Vector<float,_3> *)(weights[2].min.m_data + 1));
  max<float,3>((tcu *)&local_f8,&local_104,&local_110);
  *(undefined8 *)(__return_storage_ptr__->max).m_data = local_f8;
  (__return_storage_ptr__->max).m_data[2] = local_f0;
  return __return_storage_ptr__;
}

Assistant:

InterpolationRange interpolate (int primitiveNdx, const tcu::IVec2 pixel, const tcu::IVec2 viewportSize, bool multisample, int subpixelBits) const
	{
		// allow anywhere in the pixel area in multisample
		// allow only in the center subpixels (4 subpixels) in singlesample
		const float testSquareSize = (multisample) ? (1.0f) : (2.0f / (float)(1UL << subpixelBits));
		const float testSquarePos  = (multisample) ? (0.0f) : (0.5f - testSquareSize / 2);
		const tcu::Vec2 corners[4] =
		{
			tcu::Vec2(((float)pixel.x() + testSquarePos + 0.0f)           / (float)viewportSize.x() * 2.0f - 1.0f, ((float)pixel.y() + testSquarePos + 0.0f          ) / (float)viewportSize.y() * 2.0f - 1.0f),
			tcu::Vec2(((float)pixel.x() + testSquarePos + 0.0f)           / (float)viewportSize.x() * 2.0f - 1.0f, ((float)pixel.y() + testSquarePos + testSquareSize) / (float)viewportSize.y() * 2.0f - 1.0f),
			tcu::Vec2(((float)pixel.x() + testSquarePos + testSquareSize) / (float)viewportSize.x() * 2.0f - 1.0f, ((float)pixel.y() + testSquarePos + testSquareSize) / (float)viewportSize.y() * 2.0f - 1.0f),
			tcu::Vec2(((float)pixel.x() + testSquarePos + testSquareSize) / (float)viewportSize.x() * 2.0f - 1.0f, ((float)pixel.y() + testSquarePos + 0.0f          ) / (float)viewportSize.y() * 2.0f - 1.0f),
		};
		const InterpolationRange weights[4] =
		{
			calcTriangleInterpolationWeights(scene.triangles[primitiveNdx].positions[0], scene.triangles[primitiveNdx].positions[1], scene.triangles[primitiveNdx].positions[2], corners[0]),
			calcTriangleInterpolationWeights(scene.triangles[primitiveNdx].positions[0], scene.triangles[primitiveNdx].positions[1], scene.triangles[primitiveNdx].positions[2], corners[1]),
			calcTriangleInterpolationWeights(scene.triangles[primitiveNdx].positions[0], scene.triangles[primitiveNdx].positions[1], scene.triangles[primitiveNdx].positions[2], corners[2]),
			calcTriangleInterpolationWeights(scene.triangles[primitiveNdx].positions[0], scene.triangles[primitiveNdx].positions[1], scene.triangles[primitiveNdx].positions[2], corners[3]),
		};

		InterpolationRange result;
		result.min = tcu::min(tcu::min(weights[0].min, weights[1].min), tcu::min(weights[2].min, weights[3].min));
		result.max = tcu::max(tcu::max(weights[0].max, weights[1].max), tcu::max(weights[2].max, weights[3].max));
		return result;
	}